

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

bool __thiscall
SingleNodeColumnSampler<double,_float>::initialize
          (SingleNodeColumnSampler<double,_float> *this,double *weights,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *col_indices,size_t curr_pos,
          size_t n_sample,bool backup_weights)

{
  double dVar1;
  size_type __n;
  bool bVar2;
  uint uVar3;
  unsigned_long *puVar4;
  reference pvVar5;
  reference pvVar6;
  runtime_error *this_00;
  long in_RCX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  long in_RSI;
  long *in_RDI;
  ulong in_R8;
  byte in_R9B;
  size_t col_3;
  size_t col_2;
  size_t col_1;
  size_t col;
  long *__n_00;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff00;
  double *in_stack_ffffffffffffff08;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff10;
  long *in_stack_ffffffffffffff18;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff20;
  size_type in_stack_ffffffffffffff28;
  value_type vVar7;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff30;
  size_t *log2_n;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff40;
  double *in_stack_ffffffffffffff48;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff50;
  reference local_88;
  ulong local_78;
  undefined1 local_6d;
  undefined1 in_stack_ffffffffffffff97;
  size_type in_stack_ffffffffffffff98;
  vector<bool,_std::allocator<bool>_> *this_01;
  ulong local_58;
  ulong local_50;
  unsigned_long local_48;
  size_t local_40;
  byte local_31;
  ulong local_30;
  long local_28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_20;
  long local_18;
  bool local_1;
  
  local_31 = in_R9B & 1;
  if (in_RCX == 0) {
    local_1 = false;
  }
  else {
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    puVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x47086d);
    in_RDI[8] = (long)puVar4;
    in_RDI[9] = local_28;
    in_RDI[0xe] = in_RDI[9];
    *in_RDI = local_18;
    local_40 = log2ceil(in_RDI[9]);
    local_48 = 3;
    puVar4 = std::max<unsigned_long>(&local_40,&local_48);
    if (*puVar4 < local_30) {
      *(undefined1 *)(in_RDI + 10) = 1;
      *(undefined1 *)((long)in_RDI + 0x51) = 0;
      bVar2 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffff10);
      if (bVar2) {
        in_stack_ffffffffffffff50 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x14);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
        std::vector<double,_std::allocator<double>_>::reserve
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
        std::vector<double,_std::allocator<double>_>::reserve
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      }
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,
                 (size_type)in_stack_ffffffffffffff18);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff20,
                 (size_type)in_stack_ffffffffffffff18);
      for (local_50 = 0; local_50 < (ulong)in_RDI[9]; local_50 = local_50 + 1) {
        in_stack_ffffffffffffff40 =
             *(vector<bool,_std::allocator<bool>_> **)(in_RDI[8] + local_50 * 8);
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x17)
                            ,local_50);
        *pvVar5 = (value_type)in_stack_ffffffffffffff40;
        in_stack_ffffffffffffff48 = *(double **)(local_18 + *(long *)(in_RDI[8] + local_50 * 8) * 8)
        ;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x14),local_50);
        *pvVar6 = (value_type)in_stack_ffffffffffffff48;
        dVar1 = *(double *)(local_18 + *(long *)(in_RDI[8] + local_50 * 8) * 8);
        if ((dVar1 == 0.0) && (!NAN(dVar1))) {
          in_RDI[0xe] = in_RDI[0xe] + -1;
        }
      }
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,
                 (size_type)in_stack_ffffffffffffff18);
      log2_n = (size_t *)(in_RDI + 0xf);
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x470add);
      build_btree_sampler<double>
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                 (size_t)in_stack_ffffffffffffff40,log2_n,(size_t *)in_stack_ffffffffffffff30);
      in_RDI[7] = 0;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xf),0);
      uVar3 = std::isinf(*pvVar6);
      if ((uVar3 & 1) != 0) {
        bVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_ffffffffffffff10);
        if (bVar2) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18);
        }
        for (local_58 = 0; local_58 < (ulong)in_RDI[9]; local_58 = local_58 + 1) {
          uVar3 = std::isinf(*(double *)(local_18 + *(long *)(in_RDI[8] + local_58 * 8) * 8));
          if ((uVar3 & 1) == 0) {
            in_stack_ffffffffffffff20 =
                 *(vector<bool,_std::allocator<bool>_> **)(in_RDI[8] + local_58 * 8);
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                (in_RDI + 0x17),local_58 - in_RDI[7]);
            *pvVar5 = (value_type)in_stack_ffffffffffffff20;
            vVar7 = *(value_type *)(local_18 + *(long *)(in_RDI[8] + local_58 * 8) * 8);
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x14),
                                local_58 - in_RDI[7]);
            *pvVar6 = vVar7;
          }
          else {
            in_stack_ffffffffffffff30 =
                 *(vector<double,_std::allocator<double>_> **)(in_RDI[8] + local_58 * 8);
            __n = in_RDI[7];
            in_RDI[7] = __n + 1;
            pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                (in_RDI + 0x1a),__n);
            *pvVar5 = (value_type)in_stack_ffffffffffffff30;
            *(undefined8 *)(local_18 + *(long *)(in_RDI[8] + local_58 * 8) * 8) = 0;
          }
        }
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,
                   (size_type)in_stack_ffffffffffffff18);
        in_stack_ffffffffffffff18 = in_RDI + 0xf;
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x470cf0);
        build_btree_sampler<double>
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                   (size_t)in_stack_ffffffffffffff40,log2_n,(size_t *)in_stack_ffffffffffffff30);
      }
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,
                 (size_type)in_stack_ffffffffffffff18);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xf),0);
      if ((*pvVar6 <= 0.0) && (in_RDI[7] == 0)) {
        return false;
      }
    }
    else {
      *(undefined1 *)(in_RDI + 10) = 0;
      *(byte *)((long)in_RDI + 0x51) = local_31 & 1;
      if ((*(byte *)((long)in_RDI + 0x51) & 1) != 0) {
        bVar2 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffff10);
        if (bVar2) {
          in_stack_ffffffffffffff10 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0xb);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,
                     (size_type)in_stack_ffffffffffffff18);
        }
        std::vector<double,std::allocator<double>>::assign<double*,void>
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                   (double *)in_stack_ffffffffffffff00);
      }
      in_RDI[6] = 0;
      for (this_01 = (vector<bool,_std::allocator<bool>_> *)0x0;
          this_01 < (vector<bool,_std::allocator<bool>_> *)in_RDI[9];
          this_01 = (vector<bool,_std::allocator<bool>_> *)
                    ((long)&(this_01->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1)) {
        in_RDI[6] = (long)(*(double *)(local_18 + *(long *)(in_RDI[8] + (long)this_01 * 8) * 8) +
                          (double)in_RDI[6]);
        dVar1 = *(double *)(local_18 + *(long *)(in_RDI[8] + (long)this_01 * 8) * 8);
        if ((dVar1 == 0.0) && (!NAN(dVar1))) {
          in_RDI[0xe] = in_RDI[0xe] + -1;
        }
      }
      uVar3 = std::isnan((double)in_RDI[6]);
      if ((uVar3 & 1) != 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,"NAs encountered. Try using a different value for \'missing_action\'.\n")
        ;
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      in_RDI[7] = 0;
      uVar3 = std::isinf((double)in_RDI[6]);
      if ((uVar3 & 1) != 0) {
        bVar2 = std::vector<bool,_std::allocator<bool>_>::empty(in_stack_ffffffffffffff40);
        if (bVar2) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
          std::vector<bool,_std::allocator<bool>_>::resize
                    (this_01,in_stack_ffffffffffffff98,(bool)in_stack_ffffffffffffff97);
        }
        else {
          __n_00 = in_RDI + 1;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
          local_6d = 0;
          std::vector<bool,_std::allocator<bool>_>::assign
                    (in_stack_ffffffffffffff00,(size_type)__n_00,(bool *)0x470fa6);
        }
        in_RDI[6] = 0;
        for (local_78 = 0; local_78 < (ulong)in_RDI[9]; local_78 = local_78 + 1) {
          uVar3 = std::isinf(*(double *)(local_18 + *(long *)(in_RDI[8] + local_78 * 8) * 8));
          if ((uVar3 & 1) == 0) {
            in_RDI[6] = (long)(*(double *)(local_18 + *(long *)(in_RDI[8] + local_78 * 8) * 8) +
                              (double)in_RDI[6]);
          }
          else {
            in_RDI[7] = in_RDI[7] + 1;
            local_88 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18);
            std::_Bit_reference::operator=(&local_88,true);
            *(undefined8 *)(local_18 + *(long *)(in_RDI[8] + local_78 * 8) * 8) = 0;
          }
        }
      }
      if ((((double)in_RDI[6] == 0.0) && (!NAN((double)in_RDI[6]))) && (in_RDI[7] == 0)) {
        return false;
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SingleNodeColumnSampler<ldouble_safe, real_t>::initialize
(
    double *restrict weights,
    std::vector<size_t> *col_indices,
    size_t curr_pos,
    size_t n_sample,
    bool backup_weights
)
{
    if (!curr_pos) return false;

    this->col_indices = col_indices->data();
    this->curr_pos = curr_pos;
    this->n_left = this->curr_pos;
    this->weights_orig = weights;
    
    if (n_sample > std::max(log2ceil(this->curr_pos), (size_t)3))
    {
        this->using_tree = true;
        this->backup_weights = false;

        if (this->used_weights.empty()) {
            this->used_weights.reserve(col_indices->size());
            this->mapped_indices.reserve(col_indices->size());
            this->tree_weights.reserve(2 * col_indices->size());
        }

        this->used_weights.resize(this->curr_pos);
        this->mapped_indices.resize(this->curr_pos);

        for (size_t col = 0; col < this->curr_pos; col++) {
            this->mapped_indices[col] = this->col_indices[col];
            this->used_weights[col] = weights[this->col_indices[col]];
            if (!weights[this->col_indices[col]]) this->n_left--;
        }

        this->tree_weights.resize(0);
        build_btree_sampler(this->tree_weights, this->used_weights.data(),
                            this->curr_pos, this->tree_levels, this->offset);

        this->n_inf = 0;
        if (std::isinf(this->tree_weights[0]))
        {
            if (this->mapped_inf_indices.empty())
                this->mapped_inf_indices.resize(this->curr_pos);

            for (size_t col = 0; col < this->curr_pos; col++)
            {
                if (std::isinf(weights[this->col_indices[col]]))
                {
                    this->mapped_inf_indices[this->n_inf++] = this->col_indices[col];
                    weights[this->col_indices[col]] = 0;
                }

                else
                {
                    this->mapped_indices[col - this->n_inf] = this->col_indices[col];
                    this->used_weights[col - this->n_inf] = weights[this->col_indices[col]];
                }
            }

            this->tree_weights.resize(0);
            build_btree_sampler(this->tree_weights, this->used_weights.data(),
                                this->curr_pos - this->n_inf, this->tree_levels, this->offset);
        }

        this->used_weights.resize(0);

        if (this->tree_weights[0] <= 0 && !this->n_inf)
            return false;
    }

    else
    {
        this->using_tree = false;
        this->backup_weights = backup_weights;

        if (this->backup_weights)
        {
            if (this->weights_own.empty())
                this->weights_own.resize(col_indices->size());
            this->weights_own.assign(weights, weights + this->curr_pos);
        }

        this->cumw = 0;
        for (size_t col = 0; col < this->curr_pos; col++) {
            this->cumw += weights[this->col_indices[col]];
            if (!weights[this->col_indices[col]]) this->n_left--;
        }

        if (std::isnan(this->cumw))
            throw std::runtime_error("NAs encountered. Try using a different value for 'missing_action'.\n");

        /* if it's infinite, will choose among columns with infinite weight first */
        this->n_inf = 0;
        if (std::isinf(this->cumw))
        {
            if (this->inifinite_weights.empty())
                this->inifinite_weights.resize(col_indices->size());
            else
                this->inifinite_weights.assign(col_indices->size(), false);

            this->cumw = 0;
            for (size_t col = 0; col < this->curr_pos; col++)
            {
                if (std::isinf(weights[this->col_indices[col]])) {
                    this->n_inf++;
                    this->inifinite_weights[this->col_indices[col]] = true;
                    weights[this->col_indices[col]] = 0;
                }

                else {
                    this->cumw += weights[this->col_indices[col]];
                }
            }
        }

        if (!this->cumw && !this->n_inf) return false;
    }

    return true;
}